

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O3

uint64_t sum_quotients<long,libdivide::divider<long,(libdivide::Branching)0>>
                   (random_numerators<long> *vals,divider<long,_(libdivide::Branching)0> *div)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  uint64_t mask;
  uint64_t uVar5;
  uint8_t shift;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  
  if ((ulong)vals->_length == 0) {
    uVar5 = 0;
  }
  else {
    bVar1 = (div->div).denom.more;
    lVar2 = (div->div).denom.magic;
    lVar8 = 0;
    uVar5 = 0;
    bVar6 = bVar1 & 0x3f;
    uVar7 = (ulong)((char)bVar1 >> 7);
    do {
      uVar3 = *(ulong *)((long)vals->_pData + lVar8);
      if (lVar2 == 0) {
        lVar4 = ((long)(((long)uVar3 >> 0x3f & ~(-1L << bVar6)) + uVar3) >> bVar6 ^ uVar7) - uVar7;
      }
      else {
        lVar4 = 0;
        if ((bVar1 & 0x40) != 0) {
          lVar4 = (uVar3 ^ uVar7) - uVar7;
        }
        lVar4 = lVar4 + SUB168(SEXT816(lVar2) * SEXT816((long)uVar3),8);
        lVar4 = (lVar4 >> bVar6) - (lVar4 >> 0x3f);
      }
      uVar5 = uVar5 + lVar4;
      lVar8 = lVar8 + 8;
    } while ((ulong)vals->_length << 3 != lVar8);
  }
  return uVar5;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}